

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O2

void __thiscall
Assimp::BlenderImporter::AddBlendParams(BlenderImporter *this,aiMaterial *result,Material *source)

{
  float mirrorGlossAnisotropic;
  int mirrorGlossSamples;
  float mirrorGlossThreshold;
  float mirrorGlossAmount;
  int mirrorFadeTo;
  float mirrorMaxDist;
  int mirrorDepth;
  float mirrorBlend;
  float mirrorFresnel;
  float mirrorReflectivity;
  int mirrorUse;
  int transparencyGlossSamples;
  float transparencyGlossThreshold;
  float transparencyGlossAmount;
  int transparencyDepth;
  float transparencyLimit;
  float transparencyFalloff;
  float transparencyFilter;
  float transparencyIor;
  float transparencyBlend;
  float transparencyFresnel;
  float transparencySpecular;
  float transparencyAlpha;
  int transparencyMethod;
  int transparencyUse;
  int specularHardness;
  int specularRamp;
  int specularShader;
  float specularIntensity;
  int diffuseRamp;
  int diffuseShader;
  float diffuseIntensity;
  aiColor3D local_48;
  aiColor3D local_38;
  aiColor3D local_28;
  
  local_28.b = source->b;
  local_28.r = source->r;
  local_28.g = source->g;
  aiMaterial::AddProperty(result,&local_28,1,"$mat.blend.diffuse.color",0,0);
  diffuseIntensity = source->ref;
  aiMaterial::AddProperty(result,&diffuseIntensity,1,"$mat.blend.diffuse.intensity",0,0);
  diffuseShader = (int)source->diff_shader;
  aiMaterial::AddProperty(result,&diffuseShader,1,"$mat.blend.diffuse.shader",0,0);
  diffuseRamp = 0;
  aiMaterial::AddProperty(result,&diffuseRamp,1,"$mat.blend.diffuse.ramp",0,0);
  local_38.b = source->specb;
  local_38.r = source->specr;
  local_38.g = source->specg;
  aiMaterial::AddProperty(result,&local_38,1,"$mat.blend.specular.color",0,0);
  specularIntensity = source->spec;
  aiMaterial::AddProperty(result,&specularIntensity,1,"$mat.blend.specular.intensity",0,0);
  specularShader = (int)source->spec_shader;
  aiMaterial::AddProperty(result,&specularShader,1,"$mat.blend.specular.shader",0,0);
  specularRamp = 0;
  aiMaterial::AddProperty(result,&specularRamp,1,"$mat.blend.specular.ramp",0,0);
  specularHardness = (int)source->har;
  aiMaterial::AddProperty(result,&specularHardness,1,"$mat.blend.specular.hardness",0,0);
  transparencyUse = (uint)source->mode >> 0x10 & 1;
  aiMaterial::AddProperty(result,&transparencyUse,1,"$mat.blend.transparency.use",0,0);
  transparencyMethod = 2;
  if (((uint)source->mode >> 0x11 & 1) == 0) {
    transparencyMethod = (uint)source->mode >> 6 & 1;
  }
  aiMaterial::AddProperty(result,&transparencyMethod,1,"$mat.blend.transparency.method",0,0);
  transparencyAlpha = source->alpha;
  aiMaterial::AddProperty(result,&transparencyAlpha,1,"$mat.blend.transparency.alpha",0,0);
  transparencySpecular = source->spectra;
  aiMaterial::AddProperty(result,&transparencySpecular,1,"$mat.blend.transparency.specular",0,0);
  transparencyFresnel = source->fresnel_tra;
  aiMaterial::AddProperty(result,&transparencyFresnel,1,"$mat.blend.transparency.fresnel",0,0);
  transparencyBlend = source->fresnel_tra_i;
  aiMaterial::AddProperty(result,&transparencyBlend,1,"$mat.blend.transparency.blend",0,0);
  transparencyIor = source->ang;
  aiMaterial::AddProperty(result,&transparencyIor,1,"$mat.blend.transparency.ior",0,0);
  transparencyFilter = source->filter;
  aiMaterial::AddProperty(result,&transparencyFilter,1,"$mat.blend.transparency.filter",0,0);
  transparencyFalloff = source->tx_falloff;
  aiMaterial::AddProperty(result,&transparencyFalloff,1,"$mat.blend.transparency.falloff",0,0);
  transparencyLimit = source->tx_limit;
  aiMaterial::AddProperty(result,&transparencyLimit,1,"$mat.blend.transparency.limit",0,0);
  transparencyDepth = (int)source->ray_depth_tra;
  aiMaterial::AddProperty(result,&transparencyDepth,1,"$mat.blend.transparency.depth",0,0);
  transparencyGlossAmount = source->gloss_tra;
  aiMaterial::AddProperty
            (result,&transparencyGlossAmount,1,"$mat.blend.transparency.glossAmount",0,0);
  transparencyGlossThreshold = source->adapt_thresh_tra;
  aiMaterial::AddProperty
            (result,&transparencyGlossThreshold,1,"$mat.blend.transparency.glossThreshold",0,0);
  transparencyGlossSamples = (int)source->samp_gloss_tra;
  aiMaterial::AddProperty
            (result,&transparencyGlossSamples,1,"$mat.blend.transparency.glossSamples",0,0);
  mirrorUse = (uint)source->mode >> 0x12 & 1;
  aiMaterial::AddProperty(result,&mirrorUse,1,"$mat.blend.mirror.use",0,0);
  mirrorReflectivity = source->ray_mirror;
  aiMaterial::AddProperty(result,&mirrorReflectivity,1,"$mat.blend.mirror.reflectivity",0,0);
  local_48.b = source->mirb;
  local_48.r = source->mirr;
  local_48.g = source->mirg;
  aiMaterial::AddProperty(result,&local_48,1,"$mat.blend.mirror.color",0,0);
  mirrorFresnel = source->fresnel_mir;
  aiMaterial::AddProperty(result,&mirrorFresnel,1,"$mat.blend.mirror.fresnel",0,0);
  mirrorBlend = source->fresnel_mir_i;
  aiMaterial::AddProperty(result,&mirrorBlend,1,"$mat.blend.mirror.blend",0,0);
  mirrorDepth = (int)source->ray_depth;
  aiMaterial::AddProperty(result,&mirrorDepth,1,"$mat.blend.mirror.depth",0,0);
  mirrorMaxDist = source->dist_mir;
  aiMaterial::AddProperty(result,&mirrorMaxDist,1,"$mat.blend.mirror.maxDist",0,0);
  mirrorFadeTo = (int)source->fadeto_mir;
  aiMaterial::AddProperty(result,&mirrorFadeTo,1,"$mat.blend.mirror.fadeTo",0,0);
  mirrorGlossAmount = source->gloss_mir;
  aiMaterial::AddProperty(result,&mirrorGlossAmount,1,"$mat.blend.mirror.glossAmount",0,0);
  mirrorGlossThreshold = source->adapt_thresh_mir;
  aiMaterial::AddProperty(result,&mirrorGlossThreshold,1,"$mat.blend.mirror.glossThreshold",0,0);
  mirrorGlossSamples = (int)source->samp_gloss_mir;
  aiMaterial::AddProperty(result,&mirrorGlossSamples,1,"$mat.blend.mirror.glossSamples",0,0);
  mirrorGlossAnisotropic = source->aniso_gloss_mir;
  aiMaterial::AddProperty(result,&mirrorGlossAnisotropic,1,"$mat.blend.mirror.glossAnisotropic",0,0)
  ;
  return;
}

Assistant:

void BlenderImporter::AddBlendParams(aiMaterial* result, const Material* source)
{
    aiColor3D diffuseColor(source->r, source->g, source->b);
    result->AddProperty(&diffuseColor, 1, "$mat.blend.diffuse.color", 0, 0);

    float diffuseIntensity = source->ref;
    result->AddProperty(&diffuseIntensity, 1, "$mat.blend.diffuse.intensity", 0, 0);

    int diffuseShader = source->diff_shader;
    result->AddProperty(&diffuseShader, 1, "$mat.blend.diffuse.shader", 0, 0);

    int diffuseRamp = 0;
    result->AddProperty(&diffuseRamp, 1, "$mat.blend.diffuse.ramp", 0, 0);


    aiColor3D specularColor(source->specr, source->specg, source->specb);
    result->AddProperty(&specularColor, 1, "$mat.blend.specular.color", 0, 0);

    float specularIntensity = source->spec;
    result->AddProperty(&specularIntensity, 1, "$mat.blend.specular.intensity", 0, 0);

    int specularShader = source->spec_shader;
    result->AddProperty(&specularShader, 1, "$mat.blend.specular.shader", 0, 0);

    int specularRamp = 0;
    result->AddProperty(&specularRamp, 1, "$mat.blend.specular.ramp", 0, 0);

    int specularHardness = source->har;
    result->AddProperty(&specularHardness, 1, "$mat.blend.specular.hardness", 0, 0);


    int transparencyUse = source->mode & MA_TRANSPARENCY ? 1 : 0;
    result->AddProperty(&transparencyUse, 1, "$mat.blend.transparency.use", 0, 0);

    int transparencyMethod = source->mode & MA_RAYTRANSP ? 2 : (source->mode & MA_ZTRANSP ? 1 : 0);
    result->AddProperty(&transparencyMethod, 1, "$mat.blend.transparency.method", 0, 0);

    float transparencyAlpha = source->alpha;
    result->AddProperty(&transparencyAlpha, 1, "$mat.blend.transparency.alpha", 0, 0);

    float transparencySpecular = source->spectra;
    result->AddProperty(&transparencySpecular, 1, "$mat.blend.transparency.specular", 0, 0);

    float transparencyFresnel = source->fresnel_tra;
    result->AddProperty(&transparencyFresnel, 1, "$mat.blend.transparency.fresnel", 0, 0);

    float transparencyBlend = source->fresnel_tra_i;
    result->AddProperty(&transparencyBlend, 1, "$mat.blend.transparency.blend", 0, 0);

    float transparencyIor = source->ang;
    result->AddProperty(&transparencyIor, 1, "$mat.blend.transparency.ior", 0, 0);

    float transparencyFilter = source->filter;
    result->AddProperty(&transparencyFilter, 1, "$mat.blend.transparency.filter", 0, 0);

    float transparencyFalloff = source->tx_falloff;
    result->AddProperty(&transparencyFalloff, 1, "$mat.blend.transparency.falloff", 0, 0);

    float transparencyLimit = source->tx_limit;
    result->AddProperty(&transparencyLimit, 1, "$mat.blend.transparency.limit", 0, 0);

    int transparencyDepth = source->ray_depth_tra;
    result->AddProperty(&transparencyDepth, 1, "$mat.blend.transparency.depth", 0, 0);

    float transparencyGlossAmount = source->gloss_tra;
    result->AddProperty(&transparencyGlossAmount, 1, "$mat.blend.transparency.glossAmount", 0, 0);

    float transparencyGlossThreshold = source->adapt_thresh_tra;
    result->AddProperty(&transparencyGlossThreshold, 1, "$mat.blend.transparency.glossThreshold", 0, 0);

    int transparencyGlossSamples = source->samp_gloss_tra;
    result->AddProperty(&transparencyGlossSamples, 1, "$mat.blend.transparency.glossSamples", 0, 0);


    int mirrorUse = source->mode & MA_RAYMIRROR ? 1 : 0;
    result->AddProperty(&mirrorUse, 1, "$mat.blend.mirror.use", 0, 0);

    float mirrorReflectivity = source->ray_mirror;
    result->AddProperty(&mirrorReflectivity, 1, "$mat.blend.mirror.reflectivity", 0, 0);

    aiColor3D mirrorColor(source->mirr, source->mirg, source->mirb);
    result->AddProperty(&mirrorColor, 1, "$mat.blend.mirror.color", 0, 0);

    float mirrorFresnel = source->fresnel_mir;
    result->AddProperty(&mirrorFresnel, 1, "$mat.blend.mirror.fresnel", 0, 0);

    float mirrorBlend = source->fresnel_mir_i;
    result->AddProperty(&mirrorBlend, 1, "$mat.blend.mirror.blend", 0, 0);

    int mirrorDepth = source->ray_depth;
    result->AddProperty(&mirrorDepth, 1, "$mat.blend.mirror.depth", 0, 0);

    float mirrorMaxDist = source->dist_mir;
    result->AddProperty(&mirrorMaxDist, 1, "$mat.blend.mirror.maxDist", 0, 0);

    int mirrorFadeTo = source->fadeto_mir;
    result->AddProperty(&mirrorFadeTo, 1, "$mat.blend.mirror.fadeTo", 0, 0);

    float mirrorGlossAmount = source->gloss_mir;
    result->AddProperty(&mirrorGlossAmount, 1, "$mat.blend.mirror.glossAmount", 0, 0);

    float mirrorGlossThreshold = source->adapt_thresh_mir;
    result->AddProperty(&mirrorGlossThreshold, 1, "$mat.blend.mirror.glossThreshold", 0, 0);

    int mirrorGlossSamples = source->samp_gloss_mir;
    result->AddProperty(&mirrorGlossSamples, 1, "$mat.blend.mirror.glossSamples", 0, 0);

    float mirrorGlossAnisotropic = source->aniso_gloss_mir;
    result->AddProperty(&mirrorGlossAnisotropic, 1, "$mat.blend.mirror.glossAnisotropic", 0, 0);
}